

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-adapter.cpp
# Opt level: O3

llama_adapter_lora * llama_adapter_lora_init(llama_model *model,char *path_lora)

{
  ggml_backend_buffer_type **ppgVar1;
  _Rb_tree_node_base *__rhs;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *puVar4;
  __node_base *p_Var5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  _Head_base<0UL,_gguf_context_*,_false> _Var8;
  uint uVar9;
  int iVar10;
  llm_arch lVar11;
  llama_adapter_lora *plVar12;
  char *pcVar13;
  ggml_tensor *pgVar14;
  size_t sVar15;
  iterator iVar16;
  mapped_type *pmVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  code *pcVar20;
  ggml_backend_buffer_type **__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  _Alloc_hider _Var22;
  long lVar23;
  _Base_ptr p_Var24;
  mapped_type *ppgVar25;
  ggml_tensor *pgVar26;
  mapped_type *pmVar27;
  _Rb_tree_node_base *p_Var28;
  long lVar29;
  size_type sVar30;
  runtime_error *prVar31;
  long *plVar32;
  _Base_ptr p_Var33;
  size_type *psVar34;
  _Base_ptr p_Var35;
  _Base_ptr p_Var36;
  bool bVar37;
  float fVar38;
  undefined1 auVar39 [16];
  string adapter_type;
  llama_file gguf_file;
  gguf_context_ptr ctx_gguf;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> buft_extra;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
  ab_map;
  ggml_context_ptr ctx;
  map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
  ctx_map;
  ggml_context *buft_ctx;
  ggml_context *ctx_init;
  string local_158;
  string local_130;
  _Head_base<0UL,_gguf_context_*,_false> local_110;
  string local_108;
  llama_adapter_lora *local_e0;
  undefined1 local_d8 [32];
  _Rb_tree_node_base *local_b8;
  size_t local_b0;
  _Head_base<0UL,_ggml_context_*,_false> local_a8;
  long local_a0;
  undefined1 local_98 [32];
  _Rb_tree_node_base *local_78;
  size_type local_70;
  _Base_ptr local_68;
  llama_adapter_lora *local_60;
  llama_model *local_58;
  __node_base *local_50;
  char *local_48;
  vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
  *local_40;
  _Head_base<0UL,_ggml_context_*,_false> local_38;
  
  local_58 = model;
  plVar12 = (llama_adapter_lora *)operator_new(0x70);
  *(undefined8 *)&(plVar12->ab_map)._M_h._M_rehash_policy = 0;
  (plVar12->ab_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (plVar12->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (plVar12->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (plVar12->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (plVar12->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (plVar12->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&plVar12->alpha = 0;
  (plVar12->ab_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (plVar12->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (plVar12->ab_map)._M_h._M_buckets = &(plVar12->ab_map)._M_h._M_single_bucket;
  (plVar12->ab_map)._M_h._M_bucket_count = 1;
  (plVar12->ab_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (plVar12->ab_map)._M_h._M_element_count = 0;
  (plVar12->ab_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (plVar12->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (plVar12->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (plVar12->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (plVar12->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (plVar12->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (plVar12->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (plVar12->ab_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (plVar12->ab_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e0 = plVar12;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loading lora adapter from \'%s\' ...\n",
                     "llama_adapter_lora_init_impl",path_lora);
  local_110._M_head_impl = (gguf_context *)gguf_init_from_file(path_lora,1,&local_38);
  if (local_110._M_head_impl == (gguf_context *)0x0) {
    prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,path_lora,(allocator<char> *)&local_158);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   "failed to load lora adapter file from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::runtime_error::runtime_error(prVar31,(string *)local_98);
    __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a8._M_head_impl = local_38._M_head_impl;
  LLM_KV::LLM_KV((LLM_KV *)&local_108,LLM_ARCH_UNKNOWN,(char *)0x0);
  LLM_KV::operator()[abi_cxx11_((string *)local_d8,(LLM_KV *)&local_108,LLM_KV_GENERAL_TYPE);
  uVar9 = gguf_find_key(local_110._M_head_impl,local_d8._0_8_);
  if ((int)uVar9 < 0) {
    local_98._0_8_ = local_98 + 0x10;
    local_98._8_8_ = 0;
    local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
  }
  else {
    pcVar13 = (char *)gguf_get_val_str(local_110._M_head_impl,uVar9 & 0x7fffffff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,pcVar13,(allocator<char> *)&local_158);
  }
  pcVar2 = local_d8 + 0x10;
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  iVar10 = std::__cxx11::string::compare(local_98);
  if (iVar10 != 0) {
    prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "expect general.type to be \'adapter\', but got: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    std::runtime_error::runtime_error(prVar31,(string *)local_d8);
    __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&local_158,(LLM_KV *)&local_108,LLM_KV_GENERAL_ARCHITECTURE);
  uVar9 = gguf_find_key(local_110._M_head_impl,local_158._M_dataplus._M_p);
  if ((int)uVar9 < 0) {
    local_d8._8_8_ = 0;
    local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = pcVar2;
  }
  else {
    pcVar13 = (char *)gguf_get_val_str(local_110._M_head_impl,uVar9 & 0x7fffffff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,pcVar13,(allocator<char> *)&local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,(ulong)(local_158.field_2._M_allocated_capacity + 1))
    ;
  }
  lVar11 = llm_arch_from_string((string *)local_d8);
  if (lVar11 != local_58->arch) {
    prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar31,"model arch and LoRA arch mismatch");
    __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&local_130,(LLM_KV *)&local_108,LLM_KV_ADAPTER_TYPE);
  uVar9 = gguf_find_key(local_110._M_head_impl,local_130._M_dataplus._M_p);
  if ((int)uVar9 < 0) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_allocated_capacity =
         local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    pcVar13 = (char *)gguf_get_val_str(local_110._M_head_impl,uVar9 & 0x7fffffff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,pcVar13,(allocator<char> *)&local_68);
  }
  paVar21 = &local_130.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar21) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  iVar10 = std::__cxx11::string::compare((char *)&local_158);
  if (iVar10 != 0) {
    prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_130,"expect adapter.type to be \'lora\', but got: ",&local_158);
    std::runtime_error::runtime_error(prVar31,(string *)&local_130);
    __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&local_130,(LLM_KV *)&local_108,LLM_KV_ADAPTER_LORA_ALPHA);
  uVar9 = gguf_find_key(local_110._M_head_impl,local_130._M_dataplus._M_p);
  fVar38 = 0.0;
  if (-1 < (int)uVar9) {
    fVar38 = (float)gguf_get_val_f32(local_110._M_head_impl,uVar9 & 0x7fffffff);
  }
  local_e0->alpha = fVar38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar21) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,(ulong)(local_158.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  local_a0 = gguf_get_n_tensors(local_110._M_head_impl);
  local_98._24_8_ = local_98 + 8;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_98._16_8_ = (_Base_ptr)0x0;
  local_70 = 0;
  local_d8._24_8_ = local_d8 + 8;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
  local_d8._16_8_ = 0;
  local_b0 = 0;
  local_b8 = (_Rb_tree_node_base *)local_d8._24_8_;
  local_78 = (_Rb_tree_node_base *)local_98._24_8_;
  local_48 = path_lora;
  pgVar14 = (ggml_tensor *)ggml_get_first_tensor(local_a8._M_head_impl);
  local_50 = &(plVar12->ab_map)._M_h._M_before_begin;
  paVar3 = &local_108.field_2;
  local_60 = plVar12;
  for (; pgVar14 != (ggml_tensor *)0x0;
      pgVar14 = (ggml_tensor *)ggml_get_next_tensor(local_a8._M_head_impl,pgVar14)) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    sVar15 = strlen(pgVar14->name);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,pgVar14->name,pgVar14->name + sVar15);
    local_130.field_2._M_allocated_capacity = 0x615f61726f6c2e;
    local_130._M_string_length = 7;
    if (local_158._M_string_length < (_Base_ptr)0x7) {
LAB_00182ac2:
      local_130.field_2._M_allocated_capacity = 0x65772e6d726f6e5f;
      local_130._M_string_length = 0xc;
      local_130.field_2._8_5_ = 0x74686769;
      local_130._M_dataplus._M_p = (pointer)paVar21;
      if (local_158._M_string_length < (_Base_ptr)0xc) {
LAB_001833db:
        prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_108,"LoRA tensor \'",&local_158);
        plVar32 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_130._M_dataplus._M_p = (pointer)*plVar32;
        psVar34 = (size_type *)(plVar32 + 2);
        if ((size_type *)local_130._M_dataplus._M_p == psVar34) {
          local_130.field_2._M_allocated_capacity = *psVar34;
          local_130.field_2._8_8_ = plVar32[3];
          local_130._M_dataplus._M_p = (pointer)paVar21;
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar34;
        }
        local_130._M_string_length = plVar32[1];
        *plVar32 = (long)psVar34;
        plVar32[1] = 0;
        *(undefined1 *)(plVar32 + 2) = 0;
        std::runtime_error::runtime_error(prVar31,(string *)&local_130);
        __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar10 = std::__cxx11::string::compare
                         ((ulong)&local_158,
                          (ulong)((long)&((_Base_ptr)(local_158._M_string_length + -0x20))->_M_left
                                 + 4),(string *)0xc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar21) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if (iVar10 != 0) goto LAB_001833db;
    }
    else {
      local_130._M_dataplus._M_p = (pointer)paVar21;
      iVar10 = std::__cxx11::string::compare
                         ((ulong)&local_158,
                          (ulong)((long)&((_Base_ptr)(local_158._M_string_length + -0x20))->_M_right
                                 + 1),(string *)0x7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar21) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if (iVar10 != 0) {
        local_130.field_2._M_allocated_capacity = 0x625f61726f6c2e;
        local_130._M_string_length = 7;
        if ((_Base_ptr)0x6 < local_158._M_string_length) {
          local_130._M_dataplus._M_p = (pointer)paVar21;
          iVar10 = std::__cxx11::string::compare
                             ((ulong)&local_158,
                              (ulong)((long)&((_Base_ptr)(local_158._M_string_length + -0x20))->
                                             _M_right + 1),(string *)0x7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar21) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if (iVar10 == 0) {
            local_130.field_2._M_allocated_capacity = 0x625f61726f6c2e;
            local_130._M_string_length = 7;
            local_108._M_string_length = 0;
            local_108.field_2._M_allocated_capacity =
                 local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_130._M_dataplus._M_p = (pointer)paVar21;
            local_108._M_dataplus._M_p = (pointer)paVar3;
            replace_all(&local_158,&local_130,&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != paVar3) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != paVar21) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            iVar16 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                             *)local_d8,&local_158);
            if (iVar16._M_node == (_Base_ptr)(local_d8 + 8)) {
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                                      *)local_d8,&local_158);
              pmVar17->a = (ggml_tensor *)0x0;
            }
            else {
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                                      *)local_d8,&local_158);
            }
            pmVar17->b = pgVar14;
            goto LAB_00182b35;
          }
        }
        goto LAB_00182ac2;
      }
      local_130.field_2._M_allocated_capacity = 0x615f61726f6c2e;
      local_130._M_string_length = 7;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity =
           local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_130._M_dataplus._M_p = (pointer)paVar21;
      local_108._M_dataplus._M_p = (pointer)paVar3;
      replace_all(&local_158,&local_130,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar3) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar21) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      iVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                       *)local_d8,&local_158);
      if (iVar16._M_node == (_Base_ptr)(local_d8 + 8)) {
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                                *)local_d8,&local_158);
        pmVar17->a = pgVar14;
        pmVar17->b = (ggml_tensor *)0x0;
      }
      else {
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                                *)local_d8,&local_158);
        pmVar17->a = pgVar14;
      }
    }
LAB_00182b35:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      (ulong)(local_158.field_2._M_allocated_capacity + 1));
    }
  }
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  local_108.field_2._M_allocated_capacity = 0;
  uVar18 = ggml_backend_dev_by_type(0);
  uVar19 = ggml_backend_dev_backend_reg(uVar18);
  pcVar20 = (code *)ggml_backend_reg_get_proc_address(uVar19,"ggml_backend_dev_get_extra_bufts");
  if (((pcVar20 != (code *)0x0) &&
      (__args = (ggml_backend_buffer_type **)(*pcVar20)(uVar18),
      __args != (ggml_backend_buffer_type **)0x0)) && (*__args != (ggml_backend_buffer_type *)0x0))
  {
    do {
      std::vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>>::
      emplace_back<ggml_backend_buffer_type*&>
                ((vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>> *)
                 &local_108,__args);
      ppgVar1 = __args + 1;
      __args = __args + 1;
    } while (*ppgVar1 != (ggml_backend_buffer_type *)0x0);
  }
  if ((_Rb_tree_node_base *)local_d8._24_8_ != (_Rb_tree_node_base *)(local_d8 + 8)) {
    local_a0 = (long)(int)local_a0;
    local_40 = (vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
                *)&local_60->ctxs;
    p_Var28 = (_Rb_tree_node_base *)local_d8._24_8_;
    do {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_130._M_dataplus._M_p = (pointer)0x11;
      local_158._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_158,(ulong)&local_130);
      __rhs = p_Var28 + 1;
      local_158.field_2._M_allocated_capacity = (size_type)local_130._M_dataplus._M_p;
      *(undefined8 *)local_158._M_dataplus._M_p = 0x6d655f6e656b6f74;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 8) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 9) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 10) = '.';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xb) = 'w';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xc) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xd) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xe) = 'g';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p + 0xf) = 'h';
      local_158._M_dataplus._M_p[0x10] = 't';
      local_158._M_string_length = (size_type)local_130._M_dataplus._M_p;
      local_158._M_dataplus._M_p[(long)local_130._M_dataplus._M_p] = '\0';
      if (p_Var28[1]._M_parent < local_130._M_dataplus._M_p) {
        bVar37 = false;
      }
      else {
        iVar10 = std::__cxx11::string::compare
                           ((ulong)__rhs,
                            (long)p_Var28[1]._M_parent - (long)local_130._M_dataplus._M_p,
                            (string *)local_130._M_dataplus._M_p);
        bVar37 = iVar10 == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        (ulong)(local_158.field_2._M_allocated_capacity + 1));
      }
      if ((*(long *)(p_Var28 + 2) == 0) || (p_Var28[2]._M_parent == (_Base_ptr)0x0)) {
        prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_130,"LoRA tensor pair for \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar32 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_158._M_dataplus._M_p = (pointer)*plVar32;
        psVar34 = (size_type *)(plVar32 + 2);
        if ((size_type *)local_158._M_dataplus._M_p == psVar34) {
          local_158.field_2._M_allocated_capacity = *psVar34;
          local_158.field_2._8_8_ = plVar32[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar34;
        }
        local_158._M_string_length = plVar32[1];
        *plVar32 = (long)psVar34;
        plVar32[1] = 0;
        *(undefined1 *)(plVar32 + 2) = 0;
        std::runtime_error::runtime_error(prVar31,(string *)&local_158);
        __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pgVar14 = llama_model::get_tensor(local_58,*(char **)__rhs);
      if (pgVar14 == (ggml_tensor *)0x0) {
        prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_130,"LoRA tensor \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar32 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_158._M_dataplus._M_p = (pointer)*plVar32;
        psVar34 = (size_type *)(plVar32 + 2);
        if ((size_type *)local_158._M_dataplus._M_p == psVar34) {
          local_158.field_2._M_allocated_capacity = *psVar34;
          local_158.field_2._8_8_ = plVar32[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar34;
        }
        local_158._M_string_length = plVar32[1];
        *plVar32 = (long)psVar34;
        plVar32[1] = 0;
        *(undefined1 *)(plVar32 + 2) = 0;
        std::runtime_error::runtime_error(prVar31,(string *)&local_158);
        __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)ggml_backend_buffer_get_type(pgVar14->buffer);
      for (_Var22._M_p = local_108._M_dataplus._M_p;
          _Var22._M_p != (pointer)local_108._M_string_length; _Var22._M_p = _Var22._M_p + 8) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(undefined1 **)_Var22._M_p == paVar21) {
          uVar18 = ggml_backend_buft_name(paVar21);
          llama_log_internal(GGML_LOG_LEVEL_WARN,
                             "%s: lora for \'%s\' cannot use buft \'%s\', fallback to CPU\n",
                             "llama_adapter_lora_init_impl",pgVar14->name,uVar18);
          uVar18 = ggml_backend_dev_by_type(0);
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)ggml_backend_dev_buffer_type(uVar18);
          break;
        }
      }
      uVar18 = ggml_backend_buft_name(paVar21);
      llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: lora for \'%s\' -> \'%s\'\n",
                         "llama_adapter_lora_init_impl",pgVar14->name,uVar18);
      local_130._M_dataplus._M_p = (pointer)paVar21;
      if ((_Base_ptr)local_98._16_8_ == (_Base_ptr)0x0) {
LAB_00182f6a:
        lVar23 = ggml_tensor_overhead();
        local_158._M_dataplus._M_p = (pointer)(lVar23 * local_a0);
        local_158._M_string_length = 0;
        local_158.field_2._M_local_buf[0] = 1;
        p_Var24 = (_Base_ptr)ggml_init();
        local_68 = p_Var24;
        if (p_Var24 == (_Base_ptr)0x0) {
          p_Var24 = (_Base_ptr)0x0;
        }
        else {
          ppgVar25 = std::
                     map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
                     ::operator[]((map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
                                   *)local_98,(key_type *)&local_130);
          *ppgVar25 = (mapped_type)p_Var24;
          std::
          vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
          ::emplace_back<ggml_context*&>(local_40,(ggml_context **)&local_68);
          p_Var24 = local_68;
        }
      }
      else {
        p_Var24 = (_Base_ptr)local_98._16_8_;
        p_Var36 = (_Base_ptr)(local_98 + 8);
        do {
          p_Var35 = p_Var36;
          p_Var33 = p_Var24;
          puVar4 = *(undefined1 **)(p_Var33 + 1);
          p_Var36 = p_Var33;
          if (puVar4 < paVar21) {
            p_Var36 = p_Var35;
          }
          p_Var24 = (&p_Var33->_M_left)[puVar4 < paVar21];
        } while ((&p_Var33->_M_left)[puVar4 < paVar21] != (_Base_ptr)0x0);
        if (p_Var36 == (_Base_ptr)(local_98 + 8)) goto LAB_00182f6a;
        p_Var24 = p_Var33;
        if (puVar4 < paVar21) {
          p_Var24 = p_Var35;
        }
        if (paVar21 < *(undefined1 **)(p_Var24 + 1)) goto LAB_00182f6a;
        if (puVar4 < paVar21) {
          p_Var33 = p_Var35;
        }
        p_Var24 = p_Var33[1]._M_parent;
      }
      if (bVar37) {
        if (((_Base_ptr)pgVar14->ne[0] != (p_Var28[2]._M_parent)->_M_right) ||
           (pgVar14->ne[1] != *(long *)(*(long *)(p_Var28 + 2) + 0x18))) {
          prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_130,"tensor \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          plVar32 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_158._M_dataplus._M_p = (pointer)*plVar32;
          psVar34 = (size_type *)(plVar32 + 2);
          if ((size_type *)local_158._M_dataplus._M_p == psVar34) {
            local_158.field_2._M_allocated_capacity = *psVar34;
            local_158.field_2._8_8_ = plVar32[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar34;
          }
          local_158._M_string_length = plVar32[1];
          *plVar32 = (long)psVar34;
          plVar32[1] = 0;
          *(undefined1 *)(plVar32 + 2) = 0;
          std::runtime_error::runtime_error(prVar31,(string *)&local_158);
          __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        if (((_Base_ptr)pgVar14->ne[0] != *(_Base_ptr *)(*(long *)(p_Var28 + 2) + 0x10)) ||
           ((_Base_ptr)pgVar14->ne[1] != (p_Var28[2]._M_parent)->_M_right)) {
          prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_130,"tensor \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          plVar32 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_158._M_dataplus._M_p = (pointer)*plVar32;
          psVar34 = (size_type *)(plVar32 + 2);
          if ((size_type *)local_158._M_dataplus._M_p == psVar34) {
            local_158.field_2._M_allocated_capacity = *psVar34;
            local_158.field_2._8_8_ = plVar32[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar34;
          }
          local_158._M_string_length = plVar32[1];
          *plVar32 = (long)psVar34;
          plVar32[1] = 0;
          *(undefined1 *)(plVar32 + 2) = 0;
          std::runtime_error::runtime_error(prVar31,(string *)&local_158);
          __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (*(_Base_ptr *)(*(long *)(p_Var28 + 2) + 0x18) != (p_Var28[2]._M_parent)->_M_left) {
          prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar31,
                     "lora_a tensor is not transposed (hint: adapter from \"finetune\" example is no longer supported)"
                    );
          __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      pgVar14 = (ggml_tensor *)ggml_dup_tensor(p_Var24);
      pgVar26 = (ggml_tensor *)ggml_dup_tensor(p_Var24,p_Var28[2]._M_parent);
      ggml_set_name(pgVar14,*(long *)(p_Var28 + 2) + 0x100);
      ggml_set_name(pgVar26,p_Var28[2]._M_parent + 8);
      pmVar27 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_e0,(key_type *)__rhs);
      pmVar27->a = pgVar14;
      pmVar27->b = pgVar26;
      p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28);
    } while (p_Var28 != (_Rb_tree_node_base *)(local_d8 + 8));
  }
  plVar12 = local_60;
  std::
  vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ::reserve(&local_60->ctxs,local_70);
  std::
  vector<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ::reserve(&plVar12->bufs,local_70);
  if ((_Rb_tree_node_base *)local_98._24_8_ != (_Rb_tree_node_base *)(local_98 + 8)) {
    p_Var28 = (_Rb_tree_node_base *)local_98._24_8_;
    do {
      local_158._M_dataplus._M_p =
           (pointer)ggml_backend_alloc_ctx_tensors_from_buft
                              (p_Var28[1]._M_parent,*(undefined8 *)(p_Var28 + 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar31,"failed to allocate buffer for lora adapter\n");
        __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar18 = ggml_backend_buffer_name(local_158._M_dataplus._M_p);
      uVar19 = ggml_backend_buffer_get_size(local_158._M_dataplus._M_p);
      auVar39._8_4_ = (int)((ulong)uVar19 >> 0x20);
      auVar39._0_8_ = uVar19;
      auVar39._12_4_ = 0x45300000;
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: %10s LoRA buffer size = %8.2f MiB\n",
                         SUB84(((auVar39._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0)) *
                               0.0009765625 * 0.0009765625,0),"llama_adapter_lora_init_impl",uVar18)
      ;
      std::
      vector<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>,std::allocator<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>>>
      ::emplace_back<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>>
                ((vector<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>,std::allocator<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>>>
                  *)&plVar12->bufs,
                 (unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&local_158);
      std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
                ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&local_158);
      p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28);
    } while (p_Var28 != (_Rb_tree_node_base *)(local_98 + 8));
  }
  llama_file::llama_file((llama_file *)&local_130,local_48,"rb");
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_158._M_string_length = 0;
  local_158.field_2._M_allocated_capacity = 0;
  while (p_Var5 = local_50->_M_nxt, p_Var5 != (__node_base *)0x0) {
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                            *)local_d8,(key_type *)(p_Var5 + 1));
    pgVar14 = pmVar17->a;
    pgVar26 = pmVar17->b;
    p_Var6 = p_Var5[5]._M_nxt;
    p_Var7 = p_Var5[6]._M_nxt;
    local_50 = p_Var5;
    lVar23 = gguf_get_data_offset(local_110._M_head_impl);
    _Var8._M_head_impl = local_110._M_head_impl;
    uVar18 = gguf_find_tensor(local_110._M_head_impl,pgVar14->name);
    lVar29 = gguf_get_tensor_offset(_Var8._M_head_impl,uVar18);
    sVar30 = ggml_nbytes(pgVar14);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158,sVar30);
    llama_file::seek((llama_file *)&local_130,lVar29 + lVar23,0);
    llama_file::read_raw((llama_file *)&local_130,local_158._M_dataplus._M_p,sVar30);
    ggml_backend_tensor_set(p_Var6,local_158._M_dataplus._M_p,0,sVar30);
    lVar23 = gguf_get_data_offset(local_110._M_head_impl);
    _Var8._M_head_impl = local_110._M_head_impl;
    uVar18 = gguf_find_tensor(local_110._M_head_impl,pgVar26->name);
    lVar29 = gguf_get_tensor_offset(_Var8._M_head_impl,uVar18);
    sVar30 = ggml_nbytes(pgVar26);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158,sVar30);
    llama_file::seek((llama_file *)&local_130,lVar29 + lVar23,0);
    llama_file::read_raw((llama_file *)&local_130,local_158._M_dataplus._M_p,sVar30);
    ggml_backend_tensor_set(p_Var7,local_158._M_dataplus._M_p,0,sVar30);
  }
  if (local_158._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_158._M_dataplus._M_p,
                    local_158.field_2._M_allocated_capacity - (long)local_158._M_dataplus._M_p);
  }
  llama_file::~llama_file((llama_file *)&local_130);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loaded %zu tensors from lora file\n",
                     "llama_adapter_lora_init_impl",(local_e0->ab_map)._M_h._M_element_count * 2);
  if ((long *)local_108._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_108._M_dataplus._M_p,
                    local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
               *)local_d8);
  std::
  _Rb_tree<ggml_backend_buffer_type_*,_std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>,_std::_Select1st<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
  ::~_Rb_tree((_Rb_tree<ggml_backend_buffer_type_*,_std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>,_std::_Select1st<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
               *)local_98);
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)&local_a8);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)&local_110);
  return local_e0;
}

Assistant:

llama_adapter_lora * llama_adapter_lora_init(llama_model * model, const char * path_lora) {
    llama_adapter_lora * adapter = new llama_adapter_lora();

    try {
        llama_adapter_lora_init_impl(*model, path_lora, *adapter);
        return adapter;
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: failed to apply lora adapter: %s\n", __func__, err.what());

        delete adapter;
    }

    return nullptr;
}